

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdialog.cpp
# Opt level: O0

void __thiscall QDialog::showEvent(QDialog *this,QShowEvent *event)

{
  long lVar1;
  bool bVar2;
  QFlagsStorage<Qt::WindowState> lhs;
  WindowStates rhs;
  QWidget *in_RSI;
  long in_FS_OFFSET;
  WindowStates state;
  bool in_stack_00000033;
  WidgetAttribute in_stack_00000034;
  QWidget *in_stack_00000038;
  QWidget *in_stack_000000b0;
  QDialog *in_stack_000000b8;
  undefined4 in_stack_ffffffffffffffd0;
  WidgetAttribute in_stack_ffffffffffffffd4;
  Int IVar3;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = QEvent::spontaneous((QEvent *)in_RSI);
  if ((!bVar2) && (bVar2 = QWidget::testAttribute(in_RSI,in_stack_ffffffffffffffd4), !bVar2)) {
    lhs.i = (Int)QWidget::windowState
                           ((QWidget *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0)
                           );
    QWidget::parentWidget((QWidget *)0x744e6d);
    adjustPosition(in_stack_000000b8,in_stack_000000b0);
    QWidget::setAttribute(in_stack_00000038,in_stack_00000034,in_stack_00000033);
    IVar3 = lhs.i;
    rhs = QWidget::windowState
                    ((QWidget *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
    bVar2 = ::operator!=((QFlags<Qt::WindowState>)lhs.i,
                         (QFlags<Qt::WindowState>)
                         rhs.super_QFlagsStorageHelper<Qt::WindowState,_4>.
                         super_QFlagsStorage<Qt::WindowState>.i);
    if (bVar2) {
      QWidget::setWindowState((QWidget *)CONCAT44(IVar3,lhs.i),event._4_4_);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QDialog::showEvent(QShowEvent *event)
{
    if (!event->spontaneous() && !testAttribute(Qt::WA_Moved)) {
        Qt::WindowStates  state = windowState();
        adjustPosition(parentWidget());
        setAttribute(Qt::WA_Moved, false); // not really an explicit position
        if (state != windowState())
            setWindowState(state);
    }
}